

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::
strTree<kj::StringTree,kj::StringTree,kj::StringTree,kj::String&,char_const(&)[40],kj::String&,char_const(&)[2],kj::String&,char_const(&)[19]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,StringTree *params_1,
          StringTree *params_2,String *params_3,char (*params_4) [40],String *params_5,
          char (*params_6) [2],String *params_7,char (*params_8) [19])

{
  char *pcVar1;
  Branch *pBVar2;
  char *pcVar3;
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  char *local_60;
  char *local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  pcVar1 = (params_2->text).content.ptr;
  local_60 = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_60 = (char *)params_2->size_;
  }
  pcVar3 = (char *)0x0;
  local_58 = pcVar1 + -1;
  if (pcVar1 == (char *)0x0) {
    local_58 = pcVar3;
  }
  local_70.size_ = strlen((char *)params_3);
  pcVar1 = *(char **)(*params_4 + 8);
  local_80.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_80.ptr = *(char **)*params_4;
  }
  local_80.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_80.size_ = (size_t)pcVar3;
  }
  local_70.ptr = (char *)params_3;
  local_90.size_ = strlen((char *)params_5);
  local_90.ptr = (char *)params_5;
  pBVar2 = *(Branch **)(params_6 + 4);
  local_40.ptr = (char *)pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_40.ptr = *(char **)params_6;
  }
  local_40.size_ = (size_t)((long)&pBVar2[-1].content.branches.disposer + 7);
  if (pBVar2 == (Branch *)0x0) {
    local_40.size_ = (size_t)pcVar3;
  }
  local_50.size_ = strlen((char *)params_7);
  local_50.ptr = (char *)params_7;
  StringTree::
  concat<kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)this,params,params_1,(StringTree *)&local_60,
             &local_70,&local_80,&local_90,&local_40,&local_50,in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}